

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O0

Ch * __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  char *pcVar1;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(&this->stack_,1);
  *pcVar1 = '\0';
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>(&this->stack_,1);
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::Bottom<char>(&this->stack_);
  return pcVar1;
}

Assistant:

const Ch* GetString() const {
        // Push and pop a null terminator. This is safe.
        *stack_.template Push<Ch>() = '\0';
        stack_.template Pop<Ch>(1);

        return stack_.template Bottom<Ch>();
    }